

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNDescr.cpp
# Opt level: O0

void __thiscall NaNeuralNetDescr::NaNeuralNetDescr(NaNeuralNetDescr *this,NaNeuralNetDescr *rDescr)

{
  uint uVar1;
  long in_RSI;
  NaNeuralNetDescr *in_RDI;
  uint i;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  NaConfigPart *in_stack_ffffffffffffffc8;
  NaVector *rVect;
  uint local_20;
  
  NaLogging::NaLogging(&in_RDI->super_NaLogging);
  NaConfigPart::NaConfigPart((NaConfigPart *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super_NaLogging)._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00194828;
  (in_RDI->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaNeuralNetDescr_00194860;
  NaVector::NaVector((NaVector *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  rVect = &in_RDI->vOutputDelays;
  NaVector::NaVector((NaVector *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  in_RDI->nHidLayers = *(uint *)(in_RSI + 0x28);
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    if (local_20 < in_RDI->nHidLayers) {
      in_RDI->nHidNeurons[local_20] = *(uint *)(in_RSI + 0x2c + (ulong)local_20 * 4);
    }
    else {
      in_RDI->nHidNeurons[local_20] = 0;
    }
  }
  in_RDI->nOutNeurons = *(uint *)(in_RSI + 100);
  in_RDI->nInputsNumber = *(uint *)(in_RSI + 0x54);
  in_RDI->nInputsRepeat = *(uint *)(in_RSI + 0x58);
  in_RDI->nOutputsRepeat = *(uint *)(in_RSI + 0x5c);
  in_RDI->nFeedbackDepth = *(uint *)(in_RSI + 0x60);
  in_RDI->eLastActFunc = *(NaActFuncKind *)(in_RSI + 0x68);
  MakeDefaultDelays(in_RDI);
  uVar1 = NaVector::dim((NaVector *)(in_RSI + 0x70));
  if (uVar1 == in_RDI->nInputsRepeat) {
    NaVector::operator=((NaVector *)in_RDI,rVect);
  }
  uVar1 = NaVector::dim((NaVector *)(in_RSI + 0x88));
  if (uVar1 == in_RDI->nOutputsRepeat) {
    NaVector::operator=((NaVector *)in_RDI,rVect);
  }
  return;
}

Assistant:

NaNeuralNetDescr::NaNeuralNetDescr (const NaNeuralNetDescr& rDescr)
:   NaConfigPart(rDescr)
{
    nHidLayers = rDescr.nHidLayers;

    unsigned    i;
    for(i = 0; i < NaMAX_HIDDEN; ++i)
        if(i < nHidLayers)
            nHidNeurons[i] = rDescr.nHidNeurons[i];
        else
            nHidNeurons[i] = 0;

    nOutNeurons = rDescr.nOutNeurons;
    nInputsNumber = rDescr.nInputsNumber;
    nInputsRepeat = rDescr.nInputsRepeat;
    nOutputsRepeat = rDescr.nOutputsRepeat;
    nFeedbackDepth = rDescr.nFeedbackDepth;
    eLastActFunc = rDescr.eLastActFunc;

    MakeDefaultDelays();

    if(rDescr.vInputDelays.dim() == nInputsRepeat)
      vInputDelays = rDescr.vInputDelays;
    if(rDescr.vOutputDelays.dim() == nOutputsRepeat)
      vOutputDelays = rDescr.vOutputDelays;
}